

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

State * __thiscall anon_unknown.dwarf_497ffd::Parser::State::operator=(State *this,State *param_1)

{
  State *param_1_local;
  State *this_local;
  
  memcpy(this,param_1,0x2d);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::operator=(&this->id_to_type_id,&param_1->id_to_type_id);
  std::
  unordered_map<unsigned_int,_(anonymous_namespace)::Parser::NumberType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>_>
  ::operator=(&this->type_id_to_number_type_info,&param_1->type_id_to_number_type_info);
  std::
  unordered_map<unsigned_int,_spv_ext_inst_type_t,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>_>
  ::operator=(&this->import_id_to_ext_inst_type,&param_1->import_id_to_ext_inst_type);
  std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::operator=
            (&this->operands,&param_1->operands);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->endian_converted_words,&param_1->endian_converted_words);
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::operator=
            (&this->expected_operands,&param_1->expected_operands);
  return this;
}

Assistant:

State(const uint32_t* words_arg, size_t num_words_arg,
          spv_diagnostic* diagnostic_arg)
        : words(words_arg),
          num_words(num_words_arg),
          diagnostic(diagnostic_arg),
          word_index(0),
          instruction_count(0),
          endian(),
          requires_endian_conversion(false) {
      // Temporary storage for parser state within a single instruction.
      // Most instructions require fewer than 25 words or operands.
      operands.reserve(25);
      endian_converted_words.reserve(25);
      expected_operands.reserve(25);
    }